

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O1

void __thiscall jsonip::writer<true>::new_string(writer<true> *this,string *str)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  pre(this);
  uStack_28 = CONCAT17(0x22,(undefined7)uStack_28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->os,(char *)((long)&uStack_28 + 7),1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(str->_M_dataplus)._M_p,str->_M_string_length);
  uStack_28._0_7_ = CONCAT16(0x22,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 6),1);
  this->comma = true;
  return;
}

Assistant:

void new_string(const std::string& str)
        {
            pre();
            // TODO escape
            os << '"' << str << '"';
            comma = true;
        }